

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigRetMin.c
# Opt level: O2

void Saig_ManRetimeDup_rec(Aig_Man_t *pNew,Aig_Obj_t *pObj)

{
  Aig_Obj_t *pAVar1;
  ulong uVar2;
  Aig_Obj_t *p1;
  
  if ((pObj->field_5).pData == (void *)0x0) {
    if ((*(uint *)&pObj->field_0x18 & 7) - 7 < 0xfffffffe) {
      __assert_fail("Aig_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigRetMin.c"
                    ,0x108,"void Saig_ManRetimeDup_rec(Aig_Man_t *, Aig_Obj_t *)");
    }
    Saig_ManRetimeDup_rec(pNew,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
    Saig_ManRetimeDup_rec(pNew,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe));
    pAVar1 = Aig_ObjChild0Copy(pObj);
    if (((ulong)pObj & 1) != 0) {
      __assert_fail("!Aig_IsComplement(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                    ,0x139,"Aig_Obj_t *Aig_ObjChild1Copy(Aig_Obj_t *)");
    }
    uVar2 = (ulong)pObj->pFanin1 & 0xfffffffffffffffe;
    if (uVar2 == 0) {
      p1 = (Aig_Obj_t *)0x0;
    }
    else {
      p1 = (Aig_Obj_t *)((ulong)((uint)pObj->pFanin1 & 1) ^ *(ulong *)(uVar2 + 0x28));
    }
    pAVar1 = Aig_And(pNew,pAVar1,p1);
    (pObj->field_5).pData = pAVar1;
  }
  return;
}

Assistant:

void Saig_ManRetimeDup_rec( Aig_Man_t * pNew, Aig_Obj_t * pObj )
{
    if ( pObj->pData )
        return;
    assert( Aig_ObjIsNode(pObj) );
    Saig_ManRetimeDup_rec( pNew, Aig_ObjFanin0(pObj) );
    Saig_ManRetimeDup_rec( pNew, Aig_ObjFanin1(pObj) );
    pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
}